

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall flatbuffers::cpp::CppGenerator::GenEnumEquals(CppGenerator *this,EnumDef *enum_def)

{
  bool bVar1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *this_00;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  undefined1 local_150 [8];
  string native_type;
  allocator<char> local_109;
  string local_108;
  reference local_e8;
  EnumVal **ev;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *__range3;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  EnumDef *local_18;
  EnumDef *enum_def_local;
  CppGenerator *this_local;
  
  if (((this->opts_).super_IDLOptions.gen_compare & 1U) != 0) {
    local_18 = enum_def;
    enum_def_local = (EnumDef *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
    CodeWriter::operator+=(&this->code_,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "inline bool operator==(const {{NAME}}Union &lhs, const {{NAME}}Union &rhs) {",
               &local_71);
    CodeWriter::operator+=(&this->code_,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"  if (lhs.type != rhs.type) return false;",&local_99);
    CodeWriter::operator+=(&this->code_,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"  switch (lhs.type) {",(allocator<char> *)((long)&__range3 + 7))
    ;
    CodeWriter::operator+=(&this->code_,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    this_00 = EnumDef::Vals(local_18);
    __end3 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                       (this_00);
    ev = (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                                  *)&ev);
      if (!bVar1) break;
      local_e8 = __gnu_cxx::
                 __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                 ::operator*(&__end3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"NATIVE_ID",&local_109);
      GetEnumValUse_abi_cxx11_((string *)((long)&native_type.field_2 + 8),this,local_18,*local_e8);
      CodeWriter::SetValue(&this->code_,&local_108,(string *)((long)&native_type.field_2 + 8));
      std::__cxx11::string::~string((string *)(native_type.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
      bVar1 = EnumVal::IsNonZero(*local_e8);
      if (bVar1) {
        GetUnionElement_abi_cxx11_
                  ((string *)local_150,this,*local_e8,true,&(this->opts_).super_IDLOptions);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"NATIVE_TYPE",&local_171);
        CodeWriter::SetValue(&this->code_,&local_170,(string *)local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator(&local_171);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_198,"    case {{NATIVE_ID}}: {",&local_199);
        CodeWriter::operator+=(&this->code_,&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        std::allocator<char>::~allocator(&local_199);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c0,
                   "      return *(reinterpret_cast<const {{NATIVE_TYPE}} *>(lhs.value)) ==",
                   &local_1c1);
        CodeWriter::operator+=(&this->code_,&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator(&local_1c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,
                   "             *(reinterpret_cast<const {{NATIVE_TYPE}} *>(rhs.value));",
                   &local_1e9);
        CodeWriter::operator+=(&this->code_,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::allocator<char>::~allocator(&local_1e9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"    }",&local_211);
        CodeWriter::operator+=(&this->code_,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator(&local_211);
        std::__cxx11::string::~string((string *)local_150);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"    case {{NATIVE_ID}}: {",&local_239);
        CodeWriter::operator+=(&this->code_,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator(&local_239);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"      return true;",&local_261);
        CodeWriter::operator+=(&this->code_,&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator(&local_261);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"    }",&local_289);
        CodeWriter::operator+=(&this->code_,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator(&local_289);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&__end3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"    default: {",&local_2b1);
    CodeWriter::operator+=(&this->code_,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"      return false;",&local_2d9);
    CodeWriter::operator+=(&this->code_,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"    }",&local_301);
    CodeWriter::operator+=(&this->code_,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"  }",&local_329);
    CodeWriter::operator+=(&this->code_,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator(&local_329);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"}",&local_351);
    CodeWriter::operator+=(&this->code_,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator(&local_351);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"",&local_379);
    CodeWriter::operator+=(&this->code_,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator(&local_379);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,
               "inline bool operator!=(const {{NAME}}Union &lhs, const {{NAME}}Union &rhs) {",
               &local_3a1);
    CodeWriter::operator+=(&this->code_,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator(&local_3a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"    return !(lhs == rhs);",&local_3c9);
    CodeWriter::operator+=(&this->code_,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator(&local_3c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"}",&local_3f1);
    CodeWriter::operator+=(&this->code_,&local_3f0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"",&local_419);
    CodeWriter::operator+=(&this->code_,&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator(&local_419);
  }
  return;
}

Assistant:

void GenEnumEquals(const EnumDef &enum_def) {
    if (opts_.gen_compare) {
      code_ += "";
      code_ +=
          "inline bool operator==(const {{NAME}}Union &lhs, const "
          "{{NAME}}Union &rhs) {";
      code_ += "  if (lhs.type != rhs.type) return false;";
      code_ += "  switch (lhs.type) {";

      for (const auto &ev : enum_def.Vals()) {
        code_.SetValue("NATIVE_ID", GetEnumValUse(enum_def, *ev));
        if (ev->IsNonZero()) {
          const auto native_type = GetUnionElement(*ev, true, opts_);
          code_.SetValue("NATIVE_TYPE", native_type);
          code_ += "    case {{NATIVE_ID}}: {";
          code_ +=
              "      return *(reinterpret_cast<const {{NATIVE_TYPE}} "
              "*>(lhs.value)) ==";
          code_ +=
              "             *(reinterpret_cast<const {{NATIVE_TYPE}} "
              "*>(rhs.value));";
          code_ += "    }";
        } else {
          code_ += "    case {{NATIVE_ID}}: {";
          code_ += "      return true;";  // "NONE" enum value.
          code_ += "    }";
        }
      }
      code_ += "    default: {";
      code_ += "      return false;";
      code_ += "    }";
      code_ += "  }";
      code_ += "}";

      code_ += "";
      code_ +=
          "inline bool operator!=(const {{NAME}}Union &lhs, const "
          "{{NAME}}Union &rhs) {";
      code_ += "    return !(lhs == rhs);";
      code_ += "}";
      code_ += "";
    }
  }